

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_sockaddr.c
# Opt level: O3

int nni_posix_sockaddr2nn(nni_sockaddr *na,void *sa,size_t sz)

{
  short sVar1;
  undefined8 uVar2;
  
  sVar1 = *sa;
  if (sVar1 == 1) {
    if (sz - 0x6f < 0xffffffffffffff93) {
      return -1;
    }
    if (sz != 2) {
      if (*(char *)((long)sa + 2) == '\0') {
        na->s_family = 5;
        (na->s_in6).sa_port = (uint16_t)(sz - 3);
        memcpy((na->s_ipc).sa_path + 2,(void *)((long)sa + 3),sz - 3);
      }
      else {
        na->s_family = 2;
        nni_strlcpy((na->s_ipc).sa_path,(char *)((long)sa + 2),0x80);
      }
      return 0;
    }
    *(undefined4 *)na = 5;
  }
  else if (sVar1 == 10) {
    if (sz < 0x1c) {
      return -1;
    }
    na->s_family = 4;
    (na->s_in6).sa_port = *(uint16_t *)((long)sa + 2);
    (na->s_in6).sa_scope = *(uint32_t *)((long)sa + 0x18);
    uVar2 = *(undefined8 *)((long)sa + 0x10);
    *(undefined8 *)((na->s_ipc).sa_path + 2) = *(undefined8 *)((long)sa + 8);
    *(undefined8 *)((long)(na->s_storage).sa_pad + 4) = uVar2;
  }
  else {
    if (sVar1 != 2) {
      return -1;
    }
    if (sz < 0x10) {
      return -1;
    }
    na->s_family = 3;
    (na->s_in6).sa_port = *(uint16_t *)((long)sa + 2);
    (na->s_in).sa_addr = *(uint32_t *)((long)sa + 4);
  }
  return 0;
}

Assistant:

int
nni_posix_sockaddr2nn(nni_sockaddr *na, const void *sa, size_t sz)
{
	const struct sockaddr_in *sin;
	const struct sockaddr_un *spath;
	nng_sockaddr_in          *nsin;
	nng_sockaddr_path        *nspath;
	nng_sockaddr_abstract    *nsabs;
#ifdef NNG_ENABLE_IPV6
	const struct sockaddr_in6 *sin6;
	nng_sockaddr_in6          *nsin6;
#endif

	switch (((const struct sockaddr *) sa)->sa_family) {
	case AF_INET:
		if (sz < sizeof(*sin)) {
			return (-1);
		}
		sin             = (void *) sa;
		nsin            = &na->s_in;
		nsin->sa_family = NNG_AF_INET;
		nsin->sa_port   = sin->sin_port;
		nsin->sa_addr   = sin->sin_addr.s_addr;
		break;

#ifdef NNG_ENABLE_IPV6
	case AF_INET6:
		if (sz < sizeof(*sin6)) {
			return (-1);
		}
		sin6             = (void *) sa;
		nsin6            = &na->s_in6;
		nsin6->sa_family = NNG_AF_INET6;
		nsin6->sa_port   = sin6->sin6_port;
		nsin6->sa_scope  = sin6->sin6_scope_id;
		memcpy(nsin6->sa_addr, sin6->sin6_addr.s6_addr, 16);
		break;
#endif

	case AF_UNIX:
		// AF_UNIX can be NNG_AF_IPC, or NNG_AF_ABSTRACT.
		spath = (void *) sa;
		if ((sz < sizeof(sa_family_t)) || (sz > sizeof(*spath))) {
			return (-1);
		}
		// Now we need to look more closely.
		sz -= sizeof(sa_family_t);
		if (sz == 0) {
			// Unnamed socket.  These will be treated using
			// auto-bind if we actually listen to them, and
			// it is impossible to connect them.
			nsabs            = &na->s_abstract;
			nsabs->sa_family = NNG_AF_ABSTRACT;
			nsabs->sa_len    = 0;
		} else if (spath->sun_path[0] == 0) {
			nsabs            = &na->s_abstract;
			nsabs->sa_family = NNG_AF_ABSTRACT;
			nsabs->sa_len    = sz - 1;
			memcpy(nsabs->sa_name, &spath->sun_path[1], sz - 1);
		} else {
			nspath            = &na->s_ipc;
			nspath->sa_family = NNG_AF_IPC;
			nni_strlcpy(nspath->sa_path, spath->sun_path,
			    sizeof(nspath->sa_path));
		}
		break;
	default:
		// We should never see this - the OS should always be
		// specific about giving us either AF_INET or AF_INET6.
		// Other address families are not handled here.
		return (-1);
	}
	return (0);
}